

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestSimpleChdir::Run(ParserTestSimpleChdir *this)

{
  VirtualFileSystem *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Edge *this_01;
  StringPiece path;
  Test *pTVar2;
  int iVar3;
  Node *pNVar4;
  VirtualFileSystem *fs;
  string local_70;
  string local_50;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test-a","");
  this_00 = &(this->super_ParserTest).fs_;
  VirtualFileSystem::MakeDir(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test-a/a.ninja","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "rule cat\n  command = cat $in > $out\nbuild out2: cat in1\nbuild out1: cat in2\nbuild final: cat out1\n"
             ,"");
  VirtualFileSystem::Create(this_00,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar3 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "subninja a.ninja\n    chdir = test-a\n\nrule pipe-through-test-a\n    command = $in | test-a/final > $out\n\nbuild foo: pipe-through-test-a | test-a/final\n\n"
            );
  pTVar2 = g_current_test;
  if (iVar3 == g_current_test->assertion_failures_) {
    ParserTest::VerifyCwd_abi_cxx11_(&local_70,(ParserTest *)this_00,fs);
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    testing::Test::Check
              (pTVar2,iVar3 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
               ,0x4b0,"\"/\" == VerifyCwd(fs_)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test-a/final","");
    path.len_ = local_70._M_string_length;
    path.str_ = local_70._M_dataplus._M_p;
    pNVar4 = State::GetNode(&(this->super_ParserTest).state,path,
                            &(this->super_ParserTest).state.bindings_,0);
    this_01 = pNVar4->in_edge_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    Edge::EvaluateCommand_abi_cxx11_(&local_70,this_01,false);
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    testing::Test::Check
              (pTVar2,iVar3 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
               ,0x4b7,"\"cd \\\"test-a/\\\" && cat out1 > final\" == edge->EvaluateCommand()");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, SimpleChdir) {
  fs_.MakeDir("test-a");
  fs_.Create("test-a/a.ninja",
    "rule cat\n"
    "  command = cat $in > $out\n"
    "build out2: cat in1\n"
    "build out1: cat in2\n"
    "build final: cat out1\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"subninja a.ninja\n"
"    chdir = test-a\n"
"\n"
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
  ));
  EXPECT_EQ("/", VerifyCwd(fs_));  // Verify cwd was restored

  // Verify edge command includes correct 'cd test-a'
  Edge* edge = GetNode("test-a/final")->in_edge();
#if _WIN32
  EXPECT_EQ("cmd /c cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#else
  EXPECT_EQ("cd \"test-a/\" && cat out1 > final", edge->EvaluateCommand());
#endif
}